

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

void __thiscall amrex::FabArrayBase::RB180::define(RB180 *this,FabArrayBase *fa)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Long LVar5;
  int *piVar6;
  IntVect *pIVar7;
  Box *pBVar8;
  size_type sVar9;
  reference pvVar10;
  Box *this_00;
  FabArrayBase *in_RSI;
  long in_RDI;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *cctv;
  pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>
  *kv;
  iterator __end2;
  iterator __begin2;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *__range2;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *Tags;
  int ipass;
  CopyComTag cct;
  int src_owner;
  bool in_stack_00000137;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
  *in_stack_00000138;
  Box *in_stack_00000140;
  Box *bxrcv_1;
  int idim_1;
  Box bxsnd_1;
  int ksnd_1;
  int M_1;
  int j_1;
  Box *src_box_1;
  Box *dst_box_1;
  Box result;
  Box *gbx_1;
  int krcv_1;
  int i_1;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *recv_tags;
  Box *bxsnd;
  int dst_owner;
  Box *bxrcv;
  int krcv;
  int M;
  int j;
  Box *dst_box;
  Box *src_box;
  int idim;
  Box gbx;
  int ksnd;
  int i;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *send_tags;
  Box *domain_src;
  Rotate180Fn convert;
  Box domain_dst;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  int nlocal;
  Vector<int,_std::allocator<int>_> *imap;
  DistributionMapping *dm;
  BoxArray *ba;
  int myproc;
  IndexType typ;
  int sm;
  IntVect hi;
  IntVect low;
  value_type *in_stack_fffffffffffffb18;
  value_type *in_stack_fffffffffffffb20;
  __normal_iterator<amrex::FabArrayBase::CopyComTag_*,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>
  in_stack_fffffffffffffb28;
  __normal_iterator<amrex::FabArrayBase::CopyComTag_*,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>
  in_stack_fffffffffffffb30;
  Box *in_stack_fffffffffffffb50;
  Box *in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb60;
  int in_stack_fffffffffffffb64;
  Box *in_stack_fffffffffffffbb8;
  Rotate180Fn *in_stack_fffffffffffffbc0;
  _Self local_428;
  _Self local_420;
  value_type *local_418;
  value_type *local_410;
  int local_404;
  CopyComTag local_400;
  int local_3c0;
  Box local_3bc;
  Box *local_3a0;
  int local_398;
  Box local_394;
  int local_378;
  int local_374;
  int local_370;
  undefined1 local_36c [28];
  undefined1 *local_350;
  Box local_344;
  Box *local_328;
  undefined1 local_320 [28];
  Box local_304;
  Box *local_2e8;
  int local_2e0;
  int local_2dc;
  type local_2d8;
  CopyComTag local_2cc;
  Box local_28c;
  Box *local_270;
  int local_264;
  Box *local_260;
  int local_258;
  int local_254;
  int local_250;
  undefined1 local_24c [28];
  undefined1 *local_230;
  Box local_224;
  Box *local_208;
  int local_1fc;
  Box local_1f8;
  int local_1dc;
  int local_1d8;
  type local_1c8;
  undefined1 local_1bc [28];
  undefined1 *local_1a0;
  int local_198;
  Box local_194;
  Box local_178;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_158;
  int local_13c;
  Vector<int,_std::allocator<int>_> *local_138;
  DistributionMapping *local_130;
  BoxArray *local_128;
  int local_11c;
  FabArrayBase *local_118;
  int local_104;
  long local_100;
  int local_f4;
  long local_f0;
  int local_e4;
  long local_e0;
  int local_d4;
  long local_d0;
  undefined4 local_c4;
  int *local_c0;
  undefined4 local_b4;
  int *local_b0;
  undefined4 local_a4;
  int *local_a0;
  IntVect *local_98;
  undefined1 *local_90;
  uint local_84;
  uint local_80;
  int local_7c;
  IntVect local_78;
  IntVect local_68;
  int local_58;
  uint local_54;
  Box *local_50;
  uint local_44;
  IntVect *local_40;
  int local_38;
  uint local_34;
  IntVect *local_30;
  int local_28;
  uint local_24;
  IntVect *local_20;
  uint local_14;
  uint *local_10;
  uint local_4;
  
  local_118 = in_RSI;
  local_11c = ParallelDescriptor::MyProc();
  local_128 = boxArray(local_118);
  local_130 = DistributionMap(local_118);
  local_138 = IndexArray(local_118);
  LVar5 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x1009edf);
  local_13c = (int)LVar5;
  std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
            ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             0x1009ef3);
  this_00 = (Box *)(in_RDI + 0x2c);
  piVar6 = (int *)(in_RDI + 0x20);
  local_a4 = 0;
  local_58 = *piVar6;
  local_54 = 0;
  local_a0 = piVar6;
  local_50 = this_00;
  pIVar7 = Box::smallEnd(this_00);
  local_68.vect[2] = pIVar7->vect[2];
  local_68.vect._0_8_ = *(undefined8 *)pIVar7->vect;
  pIVar7 = Box::bigEnd(local_50);
  iVar3 = pIVar7->vect[2];
  uVar1 = *(undefined8 *)pIVar7->vect;
  local_44 = local_54;
  local_7c = local_68.vect[(int)local_54];
  local_24 = local_54;
  local_68.vect[(int)local_54] = local_7c - local_58;
  local_34 = local_54;
  local_78.vect[(int)local_54] = local_7c + -1;
  local_78.vect._0_8_ = uVar1;
  local_78.vect[2] = iVar3;
  local_40 = &local_68;
  local_38 = local_7c + -1;
  local_30 = &local_78;
  local_28 = local_7c - local_58;
  local_20 = &local_68;
  local_84 = (uint)Box::ixType(local_50);
  local_10 = &local_80;
  local_14 = local_54;
  local_4 = local_54;
  local_84 = local_84 & ~(1 << (local_54 & 0x1f));
  local_80 = local_84;
  Box::Box(&local_194,&local_68,&local_78,(IndexType)local_84);
  local_b4 = 1;
  local_b0 = piVar6;
  pBVar8 = Box::grow(&local_194,1,*(int *)(in_RDI + 0x24));
  local_178.smallend.vect._0_8_ = *(undefined8 *)(pBVar8->smallend).vect;
  uVar1 = *(undefined8 *)((pBVar8->smallend).vect + 2);
  local_178._20_8_ = *(undefined8 *)((pBVar8->bigend).vect + 2);
  local_178.bigend.vect[1] = (int)((ulong)*(undefined8 *)(pBVar8->bigend).vect >> 0x20);
  local_178.smallend.vect[2] = (int)uVar1;
  local_178.bigend.vect[0] = (int)((ulong)uVar1 >> 0x20);
  local_c4 = 2;
  local_c0 = piVar6;
  Box::grow(&local_178,2,*(int *)(in_RDI + 0x28));
  local_198 = Box::length(this_00,1);
  NonLocalBC::Rotate180Fn::operator()(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  local_1a0 = local_1bc;
  local_1c8 = std::
              unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
              ::operator*((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                           *)in_stack_fffffffffffffb20);
  for (local_1d8 = 0; local_1d8 < local_13c; local_1d8 = local_1d8 + 1) {
    piVar6 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb20,
                        (size_type)in_stack_fffffffffffffb18);
    local_1dc = *piVar6;
    BoxArray::operator[]
              ((BoxArray *)in_stack_fffffffffffffb30._M_current,
               (int)((ulong)in_stack_fffffffffffffb28._M_current >> 0x20));
    for (local_1fc = 1; local_1fc < 3; local_1fc = local_1fc + 1) {
      in_stack_fffffffffffffb64 = Box::smallEnd(&local_1f8,local_1fc);
      iVar3 = Box::smallEnd((Box *)(in_RDI + 0x2c),local_1fc);
      if (in_stack_fffffffffffffb64 == iVar3) {
        local_d0 = in_RDI + 0x20;
        local_d4 = local_1fc;
        Box::growLo(&local_1f8,local_1fc,*(int *)(local_d0 + (long)local_1fc * 4));
      }
      in_stack_fffffffffffffb60 = Box::bigEnd(&local_1f8,local_1fc);
      iVar3 = Box::bigEnd((Box *)(in_RDI + 0x2c),local_1fc);
      if (in_stack_fffffffffffffb60 == iVar3) {
        local_e0 = in_RDI + 0x20;
        local_e4 = local_1fc;
        Box::growHi(&local_1f8,local_1fc,*(int *)(local_e0 + (long)local_1fc * 4));
      }
    }
    Box::operator&(&in_stack_fffffffffffffb20->dbox,&in_stack_fffffffffffffb18->dbox);
    local_208 = &local_224;
    NonLocalBC::Rotate180Fn::operator()(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    local_230 = local_24c;
    bVar2 = Box::ok(local_208);
    if (bVar2) {
      BoxArray::intersections
                ((BoxArray *)bxrcv_1,in_stack_00000140,in_stack_00000138,in_stack_00000137,
                 _src_owner);
      local_250 = 0;
      sVar9 = std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
              ::size(&local_158);
      local_254 = (int)sVar9;
      for (; local_250 < local_254; local_250 = local_250 + 1) {
        pvVar10 = std::
                  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                  operator[](&local_158,(long)local_250);
        local_258 = pvVar10->first;
        pvVar10 = std::
                  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                  operator[](&local_158,(long)local_250);
        local_260 = &pvVar10->second;
        local_264 = DistributionMapping::operator[]
                              ((DistributionMapping *)in_stack_fffffffffffffb20,
                               (int)((ulong)in_stack_fffffffffffffb18 >> 0x20));
        if (local_264 != local_11c) {
          in_stack_fffffffffffffb50 = &local_28c;
          NonLocalBC::Rotate180Fn::operator()(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
          local_270 = in_stack_fffffffffffffb50;
          in_stack_fffffffffffffb58 =
               (Box *)std::
                      map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                      ::operator[]((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                                    *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                                   (key_type *)in_stack_fffffffffffffb58);
          CopyComTag::CopyComTag(&local_2cc,local_260,local_270,local_258,local_1dc);
          std::
          vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
          ::push_back((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                       *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        }
      }
    }
  }
  local_2d8 = std::
              unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
              ::operator*((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                           *)in_stack_fffffffffffffb20);
  for (local_2dc = 0; local_2dc < local_13c; local_2dc = local_2dc + 1) {
    piVar6 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb20,
                        (size_type)in_stack_fffffffffffffb18);
    local_2e0 = *piVar6;
    BoxArray::operator[]
              ((BoxArray *)in_stack_fffffffffffffb30._M_current,
               (int)((ulong)in_stack_fffffffffffffb28._M_current >> 0x20));
    local_98 = (IntVect *)(in_RDI + 0x20);
    local_90 = local_320;
    Box::grow(&local_304,local_98);
    local_2e8 = &local_304;
    Box::operator&(&in_stack_fffffffffffffb20->dbox,&in_stack_fffffffffffffb18->dbox);
    local_328 = &local_344;
    NonLocalBC::Rotate180Fn::operator()(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    local_350 = local_36c;
    bVar2 = Box::ok(local_328);
    if (bVar2) {
      BoxArray::intersections
                ((BoxArray *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 in_stack_fffffffffffffb58,
                 (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )in_stack_fffffffffffffb50);
      local_370 = 0;
      sVar9 = std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
              ::size(&local_158);
      local_374 = (int)sVar9;
      for (; local_370 < local_374; local_370 = local_370 + 1) {
        pvVar10 = std::
                  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                  operator[](&local_158,(long)local_370);
        local_378 = pvVar10->first;
        pvVar10 = std::
                  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                  operator[](&local_158,(long)local_370);
        local_394.smallend.vect._0_8_ = *(undefined8 *)(pvVar10->second).smallend.vect;
        local_394._8_8_ = *(undefined8 *)((pvVar10->second).smallend.vect + 2);
        local_394.bigend.vect._4_8_ = *(undefined8 *)((pvVar10->second).bigend.vect + 1);
        local_394.btype.itype = (pvVar10->second).btype.itype;
        for (local_398 = 1; local_398 < 3; local_398 = local_398 + 1) {
          iVar3 = Box::smallEnd(&local_394,local_398);
          iVar4 = Box::smallEnd((Box *)(in_RDI + 0x2c),local_398);
          if (iVar3 == iVar4) {
            local_f0 = in_RDI + 0x20;
            local_f4 = local_398;
            Box::growLo(&local_394,local_398,*(int *)(local_f0 + (long)local_398 * 4));
          }
          iVar3 = Box::bigEnd(&local_394,local_398);
          iVar4 = Box::bigEnd((Box *)(in_RDI + 0x2c),local_398);
          if (iVar3 == iVar4) {
            local_100 = in_RDI + 0x20;
            local_104 = local_398;
            Box::growHi(&local_394,local_398,*(int *)(local_100 + (long)local_398 * 4));
          }
        }
        NonLocalBC::Rotate180Fn::operator()(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
        local_3a0 = &local_3bc;
        local_3c0 = DistributionMapping::operator[]
                              ((DistributionMapping *)in_stack_fffffffffffffb20,
                               (int)((ulong)in_stack_fffffffffffffb18 >> 0x20));
        CopyComTag::CopyComTag(&local_400,local_3a0,&local_394,local_2e0,local_378);
        if (local_3c0 == local_11c) {
          std::
          unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
          ::operator->((unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                        *)0x100a9a4);
          std::
          vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
          ::push_back((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                       *)in_stack_fffffffffffffb30._M_current,in_stack_fffffffffffffb28._M_current);
        }
        else {
          in_stack_fffffffffffffb30._M_current =
               (CopyComTag *)
               std::
               map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
               ::operator[]((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                            (key_type *)in_stack_fffffffffffffb58);
          std::
          vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
          ::push_back((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                       *)in_stack_fffffffffffffb30._M_current,in_stack_fffffffffffffb28._M_current);
        }
      }
    }
  }
  for (local_404 = 0; local_404 < 2; local_404 = local_404 + 1) {
    if (local_404 == 0) {
      in_stack_fffffffffffffb28._M_current =
           (CopyComTag *)
           std::
           unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
           ::operator*((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                        *)in_stack_fffffffffffffb20);
      in_stack_fffffffffffffb20 = in_stack_fffffffffffffb28._M_current;
    }
    else {
      in_stack_fffffffffffffb18 =
           (value_type *)
           std::
           unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
           ::operator*((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                        *)in_stack_fffffffffffffb20);
      in_stack_fffffffffffffb20 = in_stack_fffffffffffffb18;
    }
    local_418 = in_stack_fffffffffffffb20;
    local_410 = in_stack_fffffffffffffb20;
    local_420._M_node =
         (_Base_ptr)
         std::
         map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
         ::begin((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                  *)in_stack_fffffffffffffb18);
    local_428._M_node =
         (_Base_ptr)
         std::
         map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
         ::end((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                *)in_stack_fffffffffffffb18);
    while (bVar2 = std::operator!=(&local_420,&local_428), bVar2) {
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
      ::operator*((_Rb_tree_iterator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                   *)0x100aaf4);
      std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
      ::begin((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
               *)in_stack_fffffffffffffb18);
      std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
      ::end((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
             *)in_stack_fffffffffffffb18);
      std::
      sort<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>>
                (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                    *)in_stack_fffffffffffffb20);
    }
  }
  std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
            ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             in_stack_fffffffffffffb30._M_current);
  return;
}

Assistant:

void
FabArrayBase::RB180::define (const FabArrayBase& fa)
{
    const int myproc = ParallelDescriptor::MyProc();
    const BoxArray& ba = fa.boxArray();
    const DistributionMapping& dm = fa.DistributionMap();
    const Vector<int>& imap = fa.IndexArray();

    const int nlocal = imap.size();
    std::vector<std::pair<int,Box> > isects;

    Box domain_dst = amrex::adjCellLo(m_domain, 0, m_ngrow[0]).grow(1, m_ngrow[1]);
#if (AMREX_SPACEDIM == 3)
    domain_dst.grow(2, m_ngrow[2]);
#endif

    auto const convert = NonLocalBC::Rotate180Fn{m_domain.length(1)};

    Box const& domain_src = convert(domain_dst);

    auto& send_tags = *m_SndTags;

    for (int i = 0; i < nlocal; ++i)
    {
        const int ksnd = imap[i];
        Box gbx = ba[ksnd];
        for (int idim = 1; idim < AMREX_SPACEDIM; ++idim) {
            if (gbx.smallEnd(idim) == m_domain.smallEnd(idim)) {
                gbx.growLo(idim, m_ngrow[idim]);
            }
            if (gbx.bigEnd(idim) == m_domain.bigEnd(idim)) {
                gbx.growHi(idim, m_ngrow[idim]);
            }
        }

        Box const& src_box = gbx & domain_src;
        Box const& dst_box = convert(src_box);

        if (src_box.ok()) {
            ba.intersections(dst_box, isects, false, m_ngrow);
            for (int j = 0, M = isects.size(); j < M; ++j) {
                const int krcv = isects[j].first;
                const Box& bxrcv = isects[j].second;
                const int dst_owner = dm[krcv];
                if (dst_owner != myproc) // local copy will be dealt with later
                {
                    Box const& bxsnd = convert(bxrcv);
                    send_tags[dst_owner].push_back(FabArrayBase::CopyComTag(bxrcv, bxsnd,
                                                                            krcv, ksnd));
                }
            }
        }
    }

    auto& recv_tags = *m_RcvTags;

    for (int i = 0; i < nlocal; ++i)
    {
        const int krcv = imap[i];
        Box const& gbx = amrex::grow(ba[krcv],m_ngrow);

        Box const& dst_box = gbx & domain_dst;
        Box const& src_box = convert(dst_box);

        if (dst_box.ok()) {
            ba.intersections(src_box, isects);
            for (int j = 0, M = isects.size(); j < M; ++j) {
                const int ksnd = isects[j].first;
                Box bxsnd = isects[j].second;
                // the ghost cells at lo-y, hi-y, lo-z, and hi-z
                // boundaries are also the source
                for (int idim = 1; idim < AMREX_SPACEDIM; ++idim) {
                    if (bxsnd.smallEnd(idim) == m_domain.smallEnd(idim)) {
                        bxsnd.growLo(idim, m_ngrow[idim]);
                    }
                    if (bxsnd.bigEnd(idim) == m_domain.bigEnd(idim)) {
                        bxsnd.growHi(idim, m_ngrow[idim]);
                    }
                }
                Box const& bxrcv = convert(bxsnd);
                const int src_owner = dm[ksnd];
                FabArrayBase::CopyComTag cct(bxrcv, bxsnd, krcv, ksnd);
                if (src_owner == myproc) {
                    m_LocTags->push_back(cct);
                } else {
                    recv_tags[src_owner].push_back(cct);
                }
            }
        }
    }

    for (int ipass = 0; ipass < 2; ++ipass) // pass 0: send; pass 1: recv
    {
        auto& Tags = (ipass == 0) ? *m_SndTags : *m_RcvTags;
        for (auto& kv : Tags)
        {
            auto& cctv = kv.second;
            // We need to fix the order so that the send and recv processes match.
            std::sort(cctv.begin(), cctv.end());
        }
    }
}